

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  void *firstElement;
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  size_t elementCount;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  DestructionOrderRecorder *ptrCopy_1;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *ptrCopy;
  DestructionOrderRecorder *ptrCopy_3;
  DestructionOrderRecorder *ptrCopy_2;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> builder;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> combined;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> arr;
  uint counter;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  void *local_98;
  long lStack_90;
  long local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  undefined8 *local_68;
  undefined8 *local_58;
  size_t sStack_50;
  undefined8 *local_48;
  undefined4 local_34;
  
  local_34 = 0;
  local_9c = 0;
  local_a0 = 0;
  local_a4 = 0;
  plVar4 = (long *)operator_new(0x10);
  *plVar4 = (long)&local_34;
  plVar4[1] = (long)&local_9c;
  plVar5 = (long *)operator_new(0x10);
  *plVar5 = (long)&local_34;
  plVar5[1] = (long)&local_a0;
  plVar6 = (long *)operator_new(0x10);
  *plVar6 = (long)&local_34;
  plVar6[1] = (long)&local_a4;
  puVar7 = (undefined8 *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_80 = &_::HeapArrayDisposer::instance;
  *puVar7 = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar7[1] = plVar4;
  sStack_50 = 1;
  local_48 = &_::HeapArrayDisposer::instance;
  local_98 = (void *)0x0;
  lStack_90 = 0;
  local_88 = 0;
  local_58 = puVar7;
  puVar8 = (undefined8 *)operator_new(0x40);
  *puVar8 = &PTR___cxa_pure_virtual_001bff08;
  puVar8[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar8[2] = plVar6;
  puVar8[3] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar8[4] = plVar5;
  puVar8[5] = puVar7;
  puVar8[6] = 1;
  puVar8[7] = &_::HeapArrayDisposer::instance;
  local_58 = (undefined8 *)0x0;
  sStack_50 = 0;
  *puVar8 = &PTR_disposeImpl_001bfd38;
  uStack_70 = 1;
  local_78 = puVar7;
  local_68 = puVar8;
  if ((local_9c != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a5,ERROR,"\"failed: expected \" \"destroyed1 == 0\"",
               (char (*) [33])"failed: expected destroyed1 == 0");
  }
  if ((local_a0 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a6,ERROR,"\"failed: expected \" \"destroyed2 == 0\"",
               (char (*) [33])"failed: expected destroyed2 == 0");
  }
  if ((local_a4 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a7,ERROR,"\"failed: expected \" \"destroyed3 == 0\"",
               (char (*) [33])"failed: expected destroyed3 == 0");
  }
  local_78 = (undefined8 *)0x0;
  uStack_70 = 0;
  (**(code **)*puVar8)
            (puVar8,puVar7,0x10,1,1,
             ArrayDisposer::
             Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::destruct
            );
  if ((local_9c != 1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ab,ERROR,"\"failed: expected \" \"destroyed1 == 1\", destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",&local_9c);
  }
  if ((local_a0 != 2) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ac,ERROR,"\"failed: expected \" \"destroyed2 == 2\", destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&local_a0);
  }
  if ((local_a4 != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ad,ERROR,"\"failed: expected \" \"destroyed3 == 3\", destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&local_a4);
  }
  uVar3 = uStack_70;
  puVar7 = local_78;
  if (local_78 != (undefined8 *)0x0) {
    local_78 = (undefined8 *)0x0;
    uStack_70 = 0;
    (**(code **)*puVar8)
              (puVar8,puVar7,0x10,uVar3,uVar3,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::
               destruct);
  }
  elementCount = sStack_50;
  puVar7 = local_58;
  if (local_58 != (undefined8 *)0x0) {
    local_58 = (undefined8 *)0x0;
    sStack_50 = 0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,puVar7,0x10,elementCount,
               elementCount,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::
               destruct);
  }
  lVar2 = local_88;
  lVar1 = lStack_90;
  firstElement = local_98;
  if (local_98 != (void *)0x0) {
    local_98 = (void *)0x0;
    lStack_90 = 0;
    local_88 = 0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,0x10,
               lVar1 - (long)firstElement >> 4,lVar2 - (long)firstElement >> 4,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::
               destruct);
  }
  return;
}

Assistant:

TEST(Array, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}